

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

BrandInitializerText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandInitializers
          (BrandInitializerText *__return_storage_ptr__,CapnpcCppMain *this,
          TemplateContext *templateContext,Schema schema)

{
  _Rb_tree_color _Var1;
  StringTree *pSVar2;
  StringTree *pSVar3;
  size_t sVar4;
  SegmentReader *pSVar5;
  CapTableReader *pCVar6;
  RemoveConst<kj::StringTree> *pRVar7;
  _Base_ptr p_Var8;
  Schema schema_00;
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  *depMap_00;
  size_t sVar9;
  char *params_2;
  _Rb_tree_color index;
  char (*params_7) [11];
  Vector<kj::StringTree> bindings;
  ArrayBuilder<kj::StringTree> scopes;
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  depMap;
  RawBrandedSchema *local_f0;
  Array<kj::StringTree> result_1;
  ArrayPtr<const_char> local_b8;
  Reader param;
  map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
  scopeMap;
  
  TemplateContext::getScopeMap(&scopeMap,templateContext);
  pRVar7 = (RemoveConst<kj::StringTree> *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x38,0,scopeMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  params_2 = (char *)0x0;
  bindings.builder.ptr =
       (StringTree *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x38,0,scopeMap._M_t._M_impl.super__Rb_tree_header._M_node_count * 2,
                  (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  schema_00.raw =
       (RawBrandedSchema *)
       (bindings.builder.ptr + scopeMap._M_t._M_impl.super__Rb_tree_header._M_node_count * 2);
  bindings.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  bindings.builder.pos = bindings.builder.ptr;
  bindings.builder.endPtr = (StringTree *)schema_00.raw;
  scopes.pos = pRVar7;
  if ((_Rb_tree_header *)scopeMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &scopeMap._M_t._M_impl.super__Rb_tree_header) {
    p_Var8 = scopeMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      params_7 = (char (*) [11])0x16dd2e;
      kj::hex((CappedArray<char,_17UL> *)&param._reader,*(unsigned_long *)(p_Var8 + 1));
      result_1.ptr = (StringTree *)
                     (((long)bindings.builder.pos - (long)bindings.builder.ptr >> 3) *
                     0x6db6db6db6db6db7);
      local_b8.ptr._0_4_ = p_Var8[2]._M_color;
      params_2 = ", brandBindings + ";
      kj::
      strTree<char_const(&)[5],char_const(&)[3],kj::CappedArray<char,17ul>,char_const(&)[19],unsigned_long,char_const(&)[3],unsigned_int,char_const(&)[11]>
                ((StringTree *)&depMap,(kj *)"  { ",(char (*) [5])0x229d72,
                 (char (*) [3])&param._reader,(CappedArray<char,_17UL> *)", brandBindings + ",
                 (char (*) [19])&result_1,(unsigned_long *)0x22b13e,(char (*) [3])&local_b8,
                 (uint *)", false},\n",params_7);
      (scopes.pos)->size_ = depMap._M_t._M_impl._0_8_;
      ((scopes.pos)->text).content.ptr =
           (char *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      ((scopes.pos)->text).content.size_ =
           (size_t)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      ((scopes.pos)->text).content.disposer =
           (ArrayDisposer *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ((scopes.pos)->branches).ptr =
           (Branch *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      ((scopes.pos)->branches).size_ = depMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
      ((scopes.pos)->branches).disposer = (ArrayDisposer *)local_f0;
      scopes.pos = scopes.pos + 1;
      _Var1 = p_Var8[2]._M_color;
      if (_Var1 != _S_red) {
        index = _S_red;
        do {
          depMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          depMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          _::ListReader::getStructElement(&param._reader,(ListReader *)&p_Var8[1]._M_parent,index);
          result_1.size_ = (size_t)param._reader.capTable;
          result_1.disposer = (ArrayDisposer *)param._reader.pointers;
          result_1.ptr = (StringTree *)param._reader.segment;
          if (param._reader.pointerCount == 0) {
            result_1.size_ = (size_t)(CapTableReader *)0x0;
            result_1.disposer = (ArrayDisposer *)(WirePointer *)0x0;
            result_1.ptr = (StringTree *)0x0;
          }
          local_b8 = (ArrayPtr<const_char>)
                     _::PointerReader::getBlob<capnp::Text>
                               ((PointerReader *)&result_1,(void *)0x0,0);
          kj::strTree<char_const(&)[31],capnp::Text::Reader,char_const(&)[6]>
                    ((StringTree *)&depMap,(kj *)"  ::capnp::_::brandBindingFor<",
                     (char (*) [31])&local_b8,(Reader *)">(),\n",(char (*) [6])params_2);
          if (bindings.builder.pos == bindings.builder.endPtr) {
            sVar9 = ((long)bindings.builder.endPtr - (long)bindings.builder.ptr >> 3) *
                    -0x2492492492492492;
            if (bindings.builder.endPtr == bindings.builder.ptr) {
              sVar9 = 4;
            }
            kj::Vector<kj::StringTree>::setCapacity(&bindings,sVar9);
          }
          (bindings.builder.pos)->size_ = depMap._M_t._M_impl._0_8_;
          ((bindings.builder.pos)->text).content.ptr =
               (char *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          ((bindings.builder.pos)->text).content.size_ =
               (size_t)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          ((bindings.builder.pos)->text).content.disposer =
               (ArrayDisposer *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          ((bindings.builder.pos)->branches).ptr =
               (Branch *)depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          ((bindings.builder.pos)->branches).size_ =
               depMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
          ((bindings.builder.pos)->branches).disposer = (ArrayDisposer *)local_f0;
          bindings.builder.pos = bindings.builder.pos + 1;
          index = index + _S_black;
        } while (_Var1 != index);
      }
      depMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      depMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      depMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      schema_00.raw = local_f0;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &scopeMap._M_t._M_impl.super__Rb_tree_header);
  }
  makeBrandDepMap(&depMap,this,(TemplateContext *)schema.raw,schema_00);
  sVar9 = depMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  param._reader.capTable =
       (CapTableReader *)(((long)scopes.pos - (long)pRVar7 >> 3) * 0x6db6db6db6db6db7);
  param._reader.data = &kj::_::HeapArrayDisposer::instance;
  param._reader.segment = (SegmentReader *)pRVar7;
  kj::strTree<char_const(&)[3],kj::Array<kj::StringTree>,char_const(&)[2]>
            (&__return_storage_ptr__->scopes,(kj *)0x22aec1,(char (*) [3])&param,
             (Array<kj::StringTree> *)"}",(char (*) [2])params_2);
  if (bindings.builder.pos != bindings.builder.endPtr) {
    kj::Vector<kj::StringTree>::setCapacity
              (&bindings,
               ((long)bindings.builder.pos - (long)bindings.builder.ptr >> 3) * 0x6db6db6db6db6db7);
  }
  result_1.size_ =
       ((long)bindings.builder.pos - (long)bindings.builder.ptr >> 3) * 0x6db6db6db6db6db7;
  result_1.ptr = bindings.builder.ptr;
  result_1.disposer = bindings.builder.disposer;
  bindings.builder.ptr = (StringTree *)0x0;
  bindings.builder.pos = (RemoveConst<kj::StringTree> *)0x0;
  bindings.builder.endPtr = (StringTree *)0x0;
  kj::strTree<char_const(&)[3],kj::Array<kj::StringTree>,char_const(&)[2]>
            (&__return_storage_ptr__->bindings,(kj *)0x22aec1,(char (*) [3])&result_1,
             (Array<kj::StringTree> *)"}",(char (*) [2])params_2);
  makeBrandDepInitializers(&__return_storage_ptr__->dependencies,(CapnpcCppMain *)&depMap,depMap_00)
  ;
  sVar4 = result_1.size_;
  pSVar2 = result_1.ptr;
  __return_storage_ptr__->dependencyCount = sVar9;
  if (result_1.ptr != (StringTree *)0x0) {
    result_1.ptr = (StringTree *)0x0;
    result_1.size_ = 0;
    (**(result_1.disposer)->_vptr_ArrayDisposer)
              (result_1.disposer,pSVar2,0x38,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  pCVar6 = param._reader.capTable;
  pSVar5 = param._reader.segment;
  if (param._reader.segment != (SegmentReader *)0x0) {
    param._reader.segment = (SegmentReader *)0x0;
    param._reader.capTable = (CapTableReader *)0x0;
    (*(code *)**param._reader.data)
              (param._reader.data,pSVar5,0x38,pCVar6,pCVar6,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_kj::StringTree>,_std::_Select1st<std::pair<const_unsigned_int,_kj::StringTree>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  ::~_Rb_tree(&depMap._M_t);
  pSVar3 = bindings.builder.endPtr;
  pRVar7 = bindings.builder.pos;
  pSVar2 = bindings.builder.ptr;
  if (bindings.builder.ptr != (StringTree *)0x0) {
    bindings.builder.ptr = (StringTree *)0x0;
    bindings.builder.pos = (RemoveConst<kj::StringTree> *)0x0;
    bindings.builder.endPtr = (StringTree *)0x0;
    (**(bindings.builder.disposer)->_vptr_ArrayDisposer)
              (bindings.builder.disposer,pSVar2,0x38,
               ((long)pRVar7 - (long)pSVar2 >> 3) * 0x6db6db6db6db6db7,
               ((long)pSVar3 - (long)pSVar2 >> 3) * 0x6db6db6db6db6db7,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
  ::~_Rb_tree(&scopeMap._M_t);
  return __return_storage_ptr__;
}

Assistant:

BrandInitializerText makeBrandInitializers(
      const TemplateContext& templateContext, Schema schema) {
    auto scopeMap = templateContext.getScopeMap();

    auto scopes = kj::heapArrayBuilder<kj::StringTree>(scopeMap.size());
    kj::Vector<kj::StringTree> bindings(scopeMap.size() * 2);  // (estimate two params per scope)

    for (auto& scope: scopeMap) {
      scopes.add(kj::strTree("  { ",
        "0x", kj::hex(scope.first), ", "
        "brandBindings + ", bindings.size(), ", ",
        scope.second.size(), ", "
        "false"
      "},\n"));

      for (auto param: scope.second) {
        bindings.add(kj::strTree("  ::capnp::_::brandBindingFor<", param.getName(), ">(),\n"));
      }
    }

    auto depMap = makeBrandDepMap(templateContext, schema);
    auto dependencyCount = depMap.size();
    return {
      kj::strTree("{\n", scopes.finish(), "}"),
      kj::strTree("{\n", bindings.releaseAsArray(), "}"),
      makeBrandDepInitializers(kj::mv(depMap)),
      dependencyCount
    };
  }